

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O1

int rnd_offensive_item(monst *mtmp)

{
  permonst *ptr;
  boolean bVar1;
  int iVar2;
  uint uVar3;
  obj *poVar4;
  int iVar5;
  int iVar6;
  
  ptr = mtmp->data;
  iVar2 = monsndx(ptr);
  iVar5 = 0;
  iVar6 = 0;
  if ((ptr->mflags1 & 0x40000) == 0) {
    iVar2 = monstr[iVar2];
    bVar1 = attacktype(ptr,0xd);
    iVar6 = iVar5;
    if ((((bVar1 == '\0') && ((mtmp->data->mflags1 & 0x10000) == 0)) && (ptr->mlet != '%')) &&
       (ptr->mlet != '6')) {
      if ((iVar2 < 8) || (uVar3 = mt_random(), 0x7507507 < uVar3 * -0x75075075)) {
        uVar3 = mt_random();
        iVar6 = 0;
        switch((ulong)uVar3 % (ulong)((iVar2 < 4 ^ 9) + (uint)(6 < iVar2) * 4)) {
        case 0:
          poVar4 = which_armor(mtmp,4);
          if ((poVar4 == (obj *)0x0) ||
             (iVar6 = 0x163,
             6 < (ushort)((*(ushort *)&objects[poVar4->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
            iVar6 = 0x163;
            if ((ptr->mflags1 & 0xc) == 0) {
              iVar6 = 0x1c4;
              if (ptr->mlet == '6') {
                iVar6 = 0x163;
              }
              if ((ptr->mflags1 >> 0x14 & 1) != 0) {
                iVar6 = 0x163;
              }
            }
          }
          break;
        case 1:
          iVar6 = 0x1c4;
          break;
        case 2:
          iVar6 = 0x141;
          break;
        case 3:
          iVar6 = 0x12d;
          break;
        case 4:
          iVar6 = 0x133;
          break;
        case 5:
          iVar6 = 0x13d;
          break;
        case 6:
          iVar6 = 0x12e;
          break;
        case 7:
        case 8:
          iVar6 = 0x1d0;
          break;
        case 9:
          iVar6 = 0x1d3;
          break;
        case 10:
          iVar6 = 0x1d1;
          break;
        case 0xb:
          iVar6 = 0x1d2;
          break;
        case 0xc:
          iVar6 = 0x1d5;
        }
      }
      else {
        iVar6 = 0x1d4;
      }
    }
  }
  return iVar6;
}

Assistant:

int rnd_offensive_item(struct monst *mtmp)
{
	const struct permonst *pm = mtmp->data;
	int difficulty = monstr[monsndx(pm)];

	if (is_animal(pm) || attacktype(pm, AT_EXPL) || mindless(mtmp->data)
			|| pm->mlet == S_GHOST || pm->mlet == S_KOP)
	    return 0;
	if (difficulty > 7 && !rn2(35)) return WAN_DEATH;
	switch (rn2(9 - (difficulty < 4) + 4 * (difficulty > 6))) {
		case 0: {
		    struct obj *helmet = which_armor(mtmp, W_ARMH);

		    if ((helmet && is_metallic(helmet)) || amorphous(pm) || passes_walls(pm) || noncorporeal(pm) || unsolid(pm))
			return SCR_EARTH;
		} /* fall through */
		case 1: return WAN_STRIKING;
		case 2: return POT_ACID;
		case 3: return POT_CONFUSION;
		case 4: return POT_BLINDNESS;
		case 5: return POT_SLEEPING;
		case 6: return POT_PARALYSIS;
		case 7: case 8:
			return WAN_MAGIC_MISSILE;
		case 9: return WAN_SLEEP;
		case 10: return WAN_FIRE;
		case 11: return WAN_COLD;
		case 12: return WAN_LIGHTNING;
	}
	/*NOTREACHED*/
	return 0;
}